

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O1

Pair * __thiscall camp::Enum::pair(Enum *this,size_t index)

{
  random_access_index_node_impl<std::allocator<char>_> *prVar1;
  Pair *pPVar2;
  OutOfRange *__return_storage_ptr__;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  if (index < (this->m_pairs).node_count) {
    prVar1 = (this->m_pairs).super_type.ptrs.spc.data_[index];
    pPVar2 = (Pair *)(prVar1 + -0xb);
    if (prVar1 == (random_access_index_node_impl<std::allocator<char>_> *)0x0) {
      pPVar2 = (Pair *)0x0;
    }
    return pPVar2;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange(&local_70,index,(this->m_pairs).node_count);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enum.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"const Enum::Pair &camp::Enum::pair(std::size_t) const","");
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_90,0x38,&local_b0);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Enum::Pair& Enum::pair(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_pairs.size())
        CAMP_ERROR(OutOfRange(index, m_pairs.size()));

    return m_pairs[index];
}